

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::BinaryTranslatorOperator::convertToMessage
          (BinaryTranslatorOperator *this,SmallBuffer *value)

{
  SmallBuffer *in_RDX;
  
  std::make_unique<helics::Message>();
  SmallBuffer::operator=
            ((SmallBuffer *)((this->super_TranslatorOperator)._vptr_TranslatorOperator + 2),in_RDX);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> BinaryTranslatorOperator::convertToMessage(const SmallBuffer& value)
{
    auto m = std::make_unique<Message>();
    m->data = value;
    return m;
}